

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

void MoveOut(Heap *heap,Chuck *chuck)

{
  byte bVar1;
  byte bVar2;
  Size SVar3;
  Size SVar4;
  uint8_t slot_1;
  uint8_t slot;
  Chuck *chuck_local;
  Heap *heap_local;
  
  if (chuck->prev == (ChuckLayout *)0x0) {
    if (chuck->next != (ChuckLayout *)0x0) {
      SetPrev(chuck->next,chuck->prev);
    }
  }
  else {
    SetNext(chuck->prev,chuck->next);
  }
  if (heap->head == heap->last) {
    if (chuck != heap->head) {
      __assert_fail("chuck == heap->head",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                    ,0x116,"void MoveOut(Heap *, Chuck *)");
    }
    heap->last = (Chuck *)0x0;
    heap->head = (Chuck *)0x0;
  }
  else {
    if (chuck == heap->head) {
      heap->head = chuck->next;
    }
    if (chuck == heap->last) {
      heap->last = chuck->prev;
    }
  }
  SVar3 = GetSize(chuck);
  if (SVar3 < 0x218) {
    SVar3 = GetSize(chuck);
    bVar1 = MatchExact(SVar3);
    if (heap->exact[bVar1] == chuck) {
      if (chuck->next != (ChuckLayout *)0x0) {
        SVar3 = GetSize(chuck->next);
        SVar4 = GetSize(chuck);
        if (SVar3 == SVar4) {
          heap->exact[bVar1] = chuck->next;
          return;
        }
      }
      heap->exact[bVar1] = (Chuck *)0x0;
    }
  }
  else {
    SVar3 = GetSize(chuck);
    bVar1 = MatchSorted(SVar3);
    if (heap->sorted[bVar1] == chuck) {
      if (chuck->next != (ChuckLayout *)0x0) {
        SVar3 = GetSize(chuck->next);
        bVar2 = MatchSorted(SVar3);
        if (bVar2 == bVar1) {
          heap->sorted[bVar1] = chuck->next;
          return;
        }
      }
      heap->sorted[bVar1] = (Chuck *)0x0;
    }
  }
  return;
}

Assistant:

static void MoveOut(Heap *heap, Chuck *chuck) {
    if (chuck->prev) {
        SetNext(chuck->prev, chuck->next);
    } else if (chuck->next) {
        SetPrev(chuck->next, chuck->prev);
    }

    if (heap->head == heap->last) {
        assert(chuck == heap->head);
        heap->head = heap->last = NULL;
    } else {
        if (chuck == heap->head) {
            heap->head = chuck->next;
        }
        if (chuck == heap->last) {
            heap->last = chuck->prev;
        }
    }

    if (GetSize(chuck) < NOT_EXACT_MIN) {
        uint8_t slot = MatchExact(GetSize(chuck));
        if (heap->exact[slot] == chuck) {
            if (!chuck->next || GetSize(chuck->next) != GetSize(chuck)) {
                heap->exact[slot] = NULL;
            } else {
                heap->exact[slot] = chuck->next;
            }
        }
    } else {
        uint8_t slot = MatchSorted(GetSize(chuck));
        if (heap->sorted[slot] == chuck) {
            if (!chuck->next || MatchSorted(GetSize((chuck->next))) != slot) {
                heap->sorted[slot] = NULL;
            } else {
                heap->sorted[slot] = chuck->next;
            }
        }
    }
}